

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

void google::protobuf::compiler::protobuf_google_2fprotobuf_2fcompiler_2fplugin_2eproto::TableStruct
     ::Shutdown(void)

{
  if (DAT_0042ec50 == '\x01') {
    DAT_0042ec50 = '\0';
    (*(code *)*_Version_default_instance_)(&_Version_default_instance_);
  }
  if (DAT_0042ed38 != (long *)0x0) {
    (**(code **)(*DAT_0042ed38 + 8))();
  }
  if (DAT_0042ecb0 == '\x01') {
    DAT_0042ecb0 = '\0';
    (*(code *)*_CodeGeneratorRequest_default_instance_)(&_CodeGeneratorRequest_default_instance_);
  }
  if (DAT_0042ed48 != (long *)0x0) {
    (**(code **)(*DAT_0042ed48 + 8))();
  }
  if (DAT_0042ece8 == '\x01') {
    DAT_0042ece8 = '\0';
    (*(code *)*_CodeGeneratorResponse_File_default_instance_)
              (&_CodeGeneratorResponse_File_default_instance_);
  }
  if (DAT_0042ed58 != (long *)0x0) {
    (**(code **)(*DAT_0042ed58 + 8))();
  }
  if (DAT_0042ed28 == '\x01') {
    DAT_0042ed28 = '\0';
    (*(code *)*_CodeGeneratorResponse_default_instance_)(&_CodeGeneratorResponse_default_instance_);
  }
  if (DAT_0042ed68 != (long *)0x0) {
    (**(code **)(*DAT_0042ed68 + 8))();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _Version_default_instance_.Shutdown();
  delete file_level_metadata[0].reflection;
  _CodeGeneratorRequest_default_instance_.Shutdown();
  delete file_level_metadata[1].reflection;
  _CodeGeneratorResponse_File_default_instance_.Shutdown();
  delete file_level_metadata[2].reflection;
  _CodeGeneratorResponse_default_instance_.Shutdown();
  delete file_level_metadata[3].reflection;
}